

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerDriver.cpp
# Opt level: O0

bool test_Player_getHand(bool verbose)

{
  CardType CVar1;
  bool bVar2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *this;
  Hand *pHVar3;
  DiceRoller *this_00;
  Player *this_01;
  vector<CardType,_std::allocator<CardType>_> *pvVar4;
  ostream *poVar5;
  reference pCVar6;
  CardType *i;
  iterator __end2;
  iterator __begin2;
  vector<CardType,_std::allocator<CardType>_> *__range2;
  Player *player1;
  DiceRoller *diceRoller;
  Deck deck;
  Hand *cards;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *ownedCountries1;
  bool success;
  bool verbose_local;
  
  this = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)operator_new(0x18);
  (this->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::vector(this);
  pHVar3 = (Hand *)operator_new(8);
  Hand::Hand(pHVar3);
  Deck::Deck((Deck *)&diceRoller,3);
  Deck::createDeck((Deck *)&diceRoller);
  Deck::draw((Deck *)&diceRoller,pHVar3);
  Deck::draw((Deck *)&diceRoller,pHVar3);
  Deck::draw((Deck *)&diceRoller,pHVar3);
  Deck::draw((Deck *)&diceRoller,pHVar3);
  this_00 = (DiceRoller *)operator_new(0x10);
  DiceRoller::DiceRoller(this_00);
  this_01 = (Player *)operator_new(0x38);
  Player::Player(this_01,this,pHVar3,this_00,1);
  pHVar3 = Player::getCards(this_01);
  pvVar4 = Hand::getHand(pHVar3);
  bVar2 = std::vector<CardType,_std::allocator<CardType>_>::empty(pvVar4);
  ownedCountries1._6_1_ = !bVar2;
  if (verbose) {
    poVar5 = std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<(poVar5,"\x1b[35m");
    pHVar3 = Player::getCards(this_01);
    pvVar4 = Hand::getHand(pHVar3);
    __end2 = std::vector<CardType,_std::allocator<CardType>_>::begin(pvVar4);
    i = (CardType *)std::vector<CardType,_std::allocator<CardType>_>::end(pvVar4);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_>
                                       *)&i), bVar2) {
      pCVar6 = __gnu_cxx::
               __normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_>::
               operator*(&__end2);
      CVar1 = *pCVar6;
      if (CVar1 == INFANTRY) {
        poVar5 = std::operator<<((ostream *)&std::cout,"player1 has a card ");
        poVar5 = std::operator<<(poVar5,"INFANTRY");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      else if (CVar1 == ARTILLERY) {
        poVar5 = std::operator<<((ostream *)&std::cout,"player1 has a card ");
        poVar5 = std::operator<<(poVar5,"ARTILLERY");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      else if (CVar1 == CAVALRY) {
        poVar5 = std::operator<<((ostream *)&std::cout,"player1 has a card ");
        poVar5 = std::operator<<(poVar5,"CAVALRY");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      __gnu_cxx::__normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_>::
      operator++(&__end2);
    }
    std::operator<<((ostream *)&std::cout,"\x1b[31m");
  }
  if (this_01 != (Player *)0x0) {
    Player::~Player(this_01);
    operator_delete(this_01,0x38);
  }
  Deck::~Deck((Deck *)&diceRoller);
  return ownedCountries1._6_1_;
}

Assistant:

bool test_Player_getHand(bool verbose = false) {

    // Arrange
    bool success = true;
    auto* ownedCountries1 = new std::vector<Map::Country*>();
    auto* cards = new Hand();
    Deck deck = Deck(3);
    deck.createDeck();
    deck.draw(*cards);
    deck.draw(*cards);
    deck.draw(*cards);
    deck.draw(*cards);
    auto* diceRoller = new DiceRoller();

    // Act
    auto* player1 = new Player(ownedCountries1, cards, diceRoller, 1);

    // Assert
    if (player1->getCards()->getHand()->empty()) {
        success = false;
    }

    if (verbose) {
        std::cout << "\n" << "\033[35m";
        for (auto& i : *player1->getCards()->getHand()) {
            switch ((int) i) {
                case 0:
                    std::cout << "player1 has a card " << "INFANTRY" << std::endl;
                    break;
                case 1:
                    std::cout << "player1 has a card " << "ARTILLERY" << std::endl;
                    break;
                case 2:
                    std::cout << "player1 has a card " << "CAVALRY" << std::endl;
                    break;
            }
        }
        std::cout << "\033[31m";
    }
    delete player1;
    return success;
}